

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxmlparser.cpp
# Opt level: O3

void __thiscall
QDBusXmlParser::QDBusXmlParser
          (QDBusXmlParser *this,QString *service,QString *path,QString *xmlData,
          DiagnosticsReporter *reporter)

{
  QSharedDataPointer<QDBusIntrospection::Object> *this_00;
  SourceLocation *pSVar1;
  int iVar2;
  Data *pDVar3;
  int *piVar4;
  QArrayData *pQVar5;
  char cVar6;
  int iVar7;
  undefined4 uVar8;
  Object *pOVar9;
  qint64 qVar10;
  qint64 qVar11;
  long lVar12;
  undefined8 *puVar13;
  char *pcVar14;
  char16_t *pcVar15;
  DiagnosticsReporter *pDVar16;
  _func_int **pp_Var17;
  long in_FS_OFFSET;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  undefined1 auVar21 [16];
  QAnyStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QString local_88;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 local_5c;
  char *local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (service->d).d;
  (this->m_service).d.d = pDVar3;
  (this->m_service).d.ptr = (service->d).ptr;
  (this->m_service).d.size = (service->d).size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar3 = (path->d).d;
  (this->m_path).d.d = pDVar3;
  (this->m_path).d.ptr = (path->d).ptr;
  (this->m_path).d.size = (path->d).size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = &this->m_object;
  pOVar9 = (Object *)operator_new(0x78);
  (pOVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  (pOVar9->location).lineNumber = 1;
  (pOVar9->location).columnNumber = 0;
  (pOVar9->service).d.d = (Data *)0x0;
  (pOVar9->service).d.ptr = (char16_t *)0x0;
  (pOVar9->service).d.size = 0;
  (pOVar9->path).d.d = (Data *)0x0;
  (pOVar9->path).d.ptr = (char16_t *)0x0;
  (pOVar9->path).d.size = 0;
  (pOVar9->interfaces).d.d = (Data *)0x0;
  (pOVar9->interfaces).d.ptr = (QString *)0x0;
  (pOVar9->interfaces).d.size = 0;
  (pOVar9->childObjects).d.d = (Data *)0x0;
  (pOVar9->childObjects).d.ptr = (QString *)0x0;
  (pOVar9->childObjects).d.size = 0;
  (this->m_object).d.ptr = pOVar9;
  LOCK();
  (pOVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pOVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  (this->m_currentInterface)._M_t.
  super___uniq_ptr_impl<QDBusIntrospection::Interface,_std::default_delete<QDBusIntrospection::Interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_QDBusIntrospection::Interface_*,_std::default_delete<QDBusIntrospection::Interface>_>
  .super__Head_base<0UL,_QDBusIntrospection::Interface_*,_false>._M_head_impl = (Interface *)0x0;
  (this->m_interfaces).d.d.ptr =
       (QMapData<std::map<QString,_QSharedDataPointer<QDBusIntrospection::Interface>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QSharedDataPointer<QDBusIntrospection::Interface>_>_>_>_>
        *)0x0;
  QVar22.m_size = (xmlData->d).size | 0x8000000000000000;
  QVar22.field_0.m_data_utf16 = (xmlData->d).ptr;
  QXmlStreamReader::QXmlStreamReader(&this->m_xml,QVar22);
  (this->m_currentLocation).lineNumber = 1;
  (this->m_currentLocation).columnNumber = 0;
  this->m_reporter = reporter;
  pOVar9 = (this->m_object).d.ptr;
  if ((__int_type)
      (pOVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1) {
    QSharedDataPointer<QDBusIntrospection::Object>::detach_helper(this_00);
    pOVar9 = (this_00->d).ptr;
  }
  QString::operator=(&pOVar9->service,&this->m_service);
  pOVar9 = (this->m_object).d.ptr;
  if ((__int_type)
      (pOVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> != 1) {
    QSharedDataPointer<QDBusIntrospection::Object>::detach_helper(this_00);
    pOVar9 = (this_00->d).ptr;
  }
  pSVar1 = &this->m_currentLocation;
  QString::operator=(&pOVar9->path,&this->m_path);
  cVar6 = QXmlStreamReader::atEnd();
  if (cVar6 == '\0') {
    iVar7 = -1;
    do {
      qVar10 = QXmlStreamReader::lineNumber();
      qVar11 = QXmlStreamReader::columnNumber();
      (this->m_currentLocation).lineNumber = qVar10;
      (this->m_currentLocation).columnNumber = qVar11;
      QXmlStreamReader::readNext();
      uVar8 = QXmlStreamReader::tokenType();
      switch(uVar8) {
      case 2:
      case 3:
      case 7:
      case 8:
        break;
      case 4:
        auVar21 = QXmlStreamReader::name();
        if ((auVar21._0_8_ == 4) &&
           (QVar19.m_data = "node", QVar19.m_size = 4, QVar24.m_data = auVar21._8_8_,
           QVar24.m_size = 4, cVar6 = QtPrivate::equalStrings(QVar19,QVar24), cVar6 != '\0')) {
          iVar7 = iVar7 + 1;
          readNode(this,iVar7);
        }
        else {
          auVar21 = QXmlStreamReader::name();
          if ((auVar21._0_8_ == 9) &&
             (QVar20.m_data = "interface", QVar20.m_size = 9, QVar25.m_data = auVar21._8_8_,
             QVar25.m_size = 9, cVar6 = QtPrivate::equalStrings(QVar20,QVar25), cVar6 != '\0')) {
            readInterface(this);
          }
          else {
            lVar12 = QXmlStreamReader::prefix();
            if (lVar12 == 0) {
              pDVar16 = this->m_reporter;
              if (pDVar16 == (DiagnosticsReporter *)0x0) {
                QtPrivateLogging::dbusParser();
                if (((byte)QtPrivateLogging::dbusParser::category.field_2.bools.enabledDebug.
                           _q_value._M_base._M_i & 1) != 0) {
                  local_70 = 2;
                  uStack_6c = 0;
                  uStack_68 = 0;
                  uStack_64 = 0;
                  uStack_60 = 0;
                  local_5c = 0;
                  local_58 = QtPrivateLogging::dbusParser::category.name;
                  auVar21 = QXmlStreamReader::name();
                  QString::QString(&local_88,auVar21._8_8_,auVar21._0_8_);
                  QString::toLocal8Bit_helper((QChar *)&local_50,(longlong)local_88.d.ptr);
                  pcVar15 = local_50.d.ptr;
                  if (local_50.d.ptr == (char16_t *)0x0) {
                    pcVar15 = (char16_t *)&QByteArray::_empty;
                  }
                  QMessageLogger::debug
                            ((char *)&local_70,"Warning: Skipping unknown element \'%s\'",pcVar15);
                  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
                    }
                  }
                  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    iVar2 = ((local_88.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i;
                    UNLOCK();
                    pQVar5 = &(local_88.d.d)->super_QArrayData;
                    goto joined_r0x0019174a;
                  }
                }
              }
              else {
                auVar21 = QXmlStreamReader::name();
                QString::QString(&local_50,auVar21._8_8_,auVar21._0_8_);
                QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)local_50.d.ptr);
                puVar13 = (undefined8 *)CONCAT44(uStack_64,uStack_68);
                if (puVar13 == (undefined8 *)0x0) {
                  puVar13 = &QByteArray::_empty;
                }
                (*pDVar16->_vptr_DiagnosticsReporter[2])
                          (pDVar16,pSVar1,"Skipping unknown element \'%s\'\n",puVar13);
                piVar4 = (int *)CONCAT44(uStack_6c,local_70);
                if (piVar4 != (int *)0x0) {
                  LOCK();
                  *piVar4 = *piVar4 + -1;
                  UNLOCK();
                  if (*piVar4 == 0) {
                    QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),1,0x10);
                  }
                }
                if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  iVar2 = ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i;
                  UNLOCK();
                  pQVar5 = &(local_50.d.d)->super_QArrayData;
joined_r0x0019174a:
                  if (iVar2 == 0) {
                    QArrayData::deallocate(pQVar5,2,0x10);
                  }
                }
              }
            }
            QXmlStreamReader::skipCurrentElement();
          }
        }
        break;
      case 5:
        auVar21 = QXmlStreamReader::name();
        if ((auVar21._0_8_ == 4) &&
           (QVar18.m_data = "node", QVar18.m_size = 4, QVar23.m_data = auVar21._8_8_,
           QVar23.m_size = 4, cVar6 = QtPrivate::equalStrings(QVar18,QVar23), cVar6 != '\0')) {
          iVar7 = iVar7 + -1;
        }
        else {
          pDVar16 = this->m_reporter;
          if (pDVar16 != (DiagnosticsReporter *)0x0) {
            auVar21 = QXmlStreamReader::name();
            QString::QString(&local_50,auVar21._8_8_,auVar21._0_8_);
            QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)local_50.d.ptr);
            puVar13 = (undefined8 *)CONCAT44(uStack_64,uStack_68);
            if (puVar13 == (undefined8 *)0x0) {
              puVar13 = &QByteArray::_empty;
            }
            pp_Var17 = pDVar16->_vptr_DiagnosticsReporter;
            pcVar14 = "Invalid node declaration \'%s\'\n";
            goto LAB_001913e8;
          }
          QtPrivateLogging::dbusParser();
          if (((byte)QtPrivateLogging::dbusParser::category.field_2.bools.enabledDebug._q_value.
                     _M_base._M_i & 1) == 0) break;
          local_70 = 2;
          uStack_6c = 0;
          uStack_68 = 0;
          uStack_64 = 0;
          uStack_60 = 0;
          local_5c = 0;
          local_58 = QtPrivateLogging::dbusParser::category.name;
          auVar21 = QXmlStreamReader::name();
          QString::QString(&local_88,auVar21._8_8_,auVar21._0_8_);
          QString::toLocal8Bit_helper((QChar *)&local_50,(longlong)local_88.d.ptr);
          pcVar15 = local_50.d.ptr;
          if (local_50.d.ptr == (char16_t *)0x0) {
            pcVar15 = (char16_t *)&QByteArray::_empty;
          }
          pcVar14 = "Error: Invalid node declaration \'%s\'";
LAB_0019158e:
          QMessageLogger::debug((char *)&local_70,pcVar14,pcVar15);
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            iVar2 = ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
            UNLOCK();
            pQVar5 = &(local_88.d.d)->super_QArrayData;
            goto joined_r0x00191422;
          }
        }
        break;
      case 6:
        cVar6 = QXmlStreamReader::isWhitespace();
        if (cVar6 == '\0') goto switchD_0019129d_default;
        break;
      default:
switchD_0019129d_default:
        pDVar16 = this->m_reporter;
        if (pDVar16 == (DiagnosticsReporter *)0x0) {
          QtPrivateLogging::dbusParser();
          if (((byte)QtPrivateLogging::dbusParser::category.field_2.bools.enabledDebug._q_value.
                     _M_base._M_i & 1) != 0) {
            local_70 = 2;
            uStack_6c = 0;
            uStack_68 = 0;
            uStack_64 = 0;
            uStack_60 = 0;
            local_5c = 0;
            local_58 = QtPrivateLogging::dbusParser::category.name;
            QXmlStreamReader::tokenString();
            QString::toLocal8Bit_helper((QChar *)&local_50,(longlong)local_88.d.ptr);
            pcVar15 = local_50.d.ptr;
            if (local_50.d.ptr == (char16_t *)0x0) {
              pcVar15 = (char16_t *)&QByteArray::_empty;
            }
            pcVar14 = "Error: Unknown token: \'%s\'";
            goto LAB_0019158e;
          }
        }
        else {
          QXmlStreamReader::tokenString();
          QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)local_50.d.ptr);
          puVar13 = (undefined8 *)CONCAT44(uStack_64,uStack_68);
          if (puVar13 == (undefined8 *)0x0) {
            puVar13 = &QByteArray::_empty;
          }
          pp_Var17 = pDVar16->_vptr_DiagnosticsReporter;
          pcVar14 = "Unknown token: \'%s\'\n";
LAB_001913e8:
          (*pp_Var17[3])(pDVar16,pSVar1,pcVar14,puVar13);
          piVar4 = (int *)CONCAT44(uStack_6c,local_70);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),1,0x10);
            }
          }
          if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            iVar2 = ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
            UNLOCK();
            pQVar5 = &(local_50.d.d)->super_QArrayData;
joined_r0x00191422:
            if (iVar2 == 0) {
              QArrayData::deallocate(pQVar5,2,0x10);
            }
          }
        }
      }
      cVar6 = QXmlStreamReader::atEnd();
    } while (cVar6 == '\0');
  }
  iVar7 = QXmlStreamReader::error();
  if (iVar7 == 0) goto LAB_0019182e;
  pDVar16 = this->m_reporter;
  if (pDVar16 == (DiagnosticsReporter *)0x0) {
    QtPrivateLogging::dbusParser();
    if (((byte)QtPrivateLogging::dbusParser::category.field_2.bools.enabledDebug._q_value._M_base.
               _M_i & 1) == 0) goto LAB_0019182e;
    local_70 = 2;
    uStack_6c = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    local_5c = 0;
    local_58 = QtPrivateLogging::dbusParser::category.name;
    QXmlStreamReader::errorString();
    QString::toLocal8Bit_helper((QChar *)&local_50,(longlong)local_88.d.ptr);
    if (local_50.d.ptr == (char16_t *)0x0) {
      local_50.d.ptr = (char16_t *)&QByteArray::_empty;
    }
    QMessageLogger::debug((char *)&local_70,"Error: XML error: %s",local_50.d.ptr);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0019182e;
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar7 = ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  else {
    QXmlStreamReader::errorString();
    QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)local_50.d.ptr);
    puVar13 = (undefined8 *)CONCAT44(uStack_64,uStack_68);
    if (puVar13 == (undefined8 *)0x0) {
      puVar13 = &QByteArray::_empty;
    }
    (*pDVar16->_vptr_DiagnosticsReporter[3])(pDVar16,pSVar1,"XML error: %s\n",puVar13);
    piVar4 = (int *)CONCAT44(uStack_6c,local_70);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_6c,local_70),1,0x10);
      }
    }
    if (&(local_50.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_0019182e;
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar7 = ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    local_88.d.d = local_50.d.d;
  }
  if (iVar7 == 0) {
    QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
  }
LAB_0019182e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDBusXmlParser::QDBusXmlParser(const QString &service, const QString &path, const QString &xmlData,
                               QDBusIntrospection::DiagnosticsReporter *reporter)
    : m_service(service),
      m_path(path),
      m_object(new QDBusIntrospection::Object),
      m_xml(xmlData),
      m_reporter(reporter)
{
    m_object->service = m_service;
    m_object->path = m_path;

    int nodeLevel = -1;

    while (!m_xml.atEnd()) {
        updateCurrentLocation();
        m_xml.readNext();

        switch (m_xml.tokenType()) {
        case QXmlStreamReader::StartElement:
            if (m_xml.name() == "node"_L1) {
                readNode(++nodeLevel);
            } else if (m_xml.name() == "interface"_L1) {
                readInterface();
            } else {
                if (m_xml.prefix().isEmpty()) {
                    qDBusParserWarning("Skipping unknown element '%s'",
                                       qPrintable(m_xml.name().toString()));
                }
                m_xml.skipCurrentElement();
            }
            break;
        case QXmlStreamReader::EndElement:
            if (m_xml.name() == "node"_L1) {
                --nodeLevel;
            } else {
                qDBusParserError("Invalid node declaration '%s'",
                                 qPrintable(m_xml.name().toString()));
            }
            break;
        case QXmlStreamReader::StartDocument:
        case QXmlStreamReader::EndDocument:
        case QXmlStreamReader::DTD:
            // not interested
            break;
        case QXmlStreamReader::Comment:
            // ignore comments and processing instructions
            break;
        case QXmlStreamReader::Characters:
            // ignore whitespace
            if (m_xml.isWhitespace())
                break;
            Q_FALLTHROUGH();
        default:
            qDBusParserError("Unknown token: '%s'", qPrintable(m_xml.tokenString()));
            break;
        }
    }

    if (m_xml.hasError())
        qDBusParserError("XML error: %s", qPrintable(m_xml.errorString()));
}